

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O0

void __thiscall
fill<64U,_33U,_buffer_layout_dfs>::operator()
          (fill<64U,_33U,_buffer_layout_dfs> *this,array<Stream,_64UL> *streams,uchar **buffer,
          array<unsigned_long,_64UL> *buffer_count)

{
  size_t sVar1;
  uchar **ppuVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  long lVar8;
  array<unsigned_long,_64UL> *buffer_count_local;
  uchar **buffer_local;
  array<Stream,_64UL> *streams_local;
  fill<64U,_33U,_buffer_layout_dfs> *this_local;
  long local_38;
  size_t n_1;
  size_t n;
  size_t empty;
  
  pvVar6 = std::array<unsigned_long,_64UL>::operator[](buffer_count,0x21);
  if (*pvVar6 != 0) {
    __assert_fail("buffer_count[I] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                  ,0x13b,
                  "void fill_leaf(std::array<Stream, K> &__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict, std::true_type) [K = 64U, I = 33U, BufferLayout = buffer_layout_dfs]"
                 );
  }
  pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
  sVar1 = pvVar7->n;
  pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
  if (sVar1 + pvVar7->n < 0x17) {
    pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
    sVar1 = pvVar7->n;
    pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
    lVar8 = (0x17 - sVar1) - pvVar7->n;
    n_1 = 0x17;
    pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
    sVar1 = n_1;
    if (pvVar7->n == 0) {
LAB_001d4bcd:
      n_1 = sVar1;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
      ppuVar4 = pvVar7->stream;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
      ppuVar2 = pvVar7->stream;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,ppuVar2 + pvVar7->n,buffer + lVar8 + (0x255 - n_1));
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
      pvVar7->n = 0;
      pvVar6 = std::array<unsigned_long,_64UL>::operator[](buffer_count,0x21);
      *pvVar6 = 0x17 - lVar8;
    }
    else {
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
      if (pvVar7->n != 0) {
        do {
          pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
          puVar3 = *pvVar7->stream;
          pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
          iVar5 = cmp(puVar3,*pvVar7->stream);
          if (iVar5 < 1) {
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
            buffer[lVar8 + (0x255 - n_1)] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
            sVar1 = n_1 - 1;
            if (pvVar7->n == 0) goto LAB_001d4bcd;
          }
          else {
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
            buffer[lVar8 + (0x255 - n_1)] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
            sVar1 = n_1 - 1;
            if (pvVar7->n == 0) break;
          }
          n_1 = n_1 - 1;
        } while( true );
      }
      n_1 = sVar1;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
      ppuVar4 = pvVar7->stream;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
      ppuVar2 = pvVar7->stream;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,ppuVar2 + pvVar7->n,buffer + lVar8 + (0x255 - n_1));
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
      pvVar7->n = 0;
      pvVar6 = std::array<unsigned_long,_64UL>::operator[](buffer_count,0x21);
      *pvVar6 = 0x17 - lVar8;
      check_input(buffer + lVar8 + 0x23e,0x17 - lVar8);
    }
  }
  else {
    local_38 = 0x17;
    pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
    lVar8 = local_38;
    if (pvVar7->n == 0) {
LAB_001d4f4d:
      local_38 = lVar8;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
      ppuVar4 = pvVar7->stream;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,pvVar7->stream + local_38,buffer + (0x255 - local_38));
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
      pvVar7->n = pvVar7->n - local_38;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
      pvVar7->stream = pvVar7->stream + local_38;
      pvVar6 = std::array<unsigned_long,_64UL>::operator[](buffer_count,0x21);
      *pvVar6 = 0x17;
      check_input(buffer + 0x23e,0x17);
    }
    else {
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
      if (pvVar7->n == 0) {
LAB_001d5030:
        local_38 = lVar8;
        pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
        ppuVar4 = pvVar7->stream;
        pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
        std::copy<unsigned_char**,unsigned_char**>
                  (ppuVar4,pvVar7->stream + local_38,buffer + (0x255 - local_38));
        pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
        pvVar7->n = pvVar7->n - local_38;
        pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
        pvVar7->stream = pvVar7->stream + local_38;
        pvVar6 = std::array<unsigned_long,_64UL>::operator[](buffer_count,0x21);
        *pvVar6 = 0x17;
        check_input(buffer + 0x23e,0x17);
      }
      else {
        for (; local_38 != 0; local_38 = local_38 + -1) {
          pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
          puVar3 = *pvVar7->stream;
          pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
          iVar5 = cmp(puVar3,*pvVar7->stream);
          if (iVar5 < 1) {
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
            buffer[0x255 - local_38] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,2);
            lVar8 = local_38 + -1;
            if (pvVar7->n == 0) goto LAB_001d4f4d;
          }
          else {
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
            buffer[0x255 - local_38] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,3);
            lVar8 = local_38 + -1;
            if (pvVar7->n == 0) goto LAB_001d5030;
          }
        }
        pvVar6 = std::array<unsigned_long,_64UL>::operator[](buffer_count,0x21);
        *pvVar6 = 0x17;
        check_input(buffer + 0x23e,0x17);
      }
    }
  }
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}